

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaggageTest.cpp
# Opt level: O0

void __thiscall
jaegertracing::baggage::Baggage_restrictionManagerTest_Test::Baggage_restrictionManagerTest_Test
          (Baggage_restrictionManagerTest_Test *this)

{
  Baggage_restrictionManagerTest_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__Baggage_restrictionManagerTest_Test_003b0900;
  return;
}

Assistant:

TEST(Baggage, restrictionManagerTest)
{
    auto logFn = &log<std::vector<Tag>::const_iterator>;
    TestRestrictionManager manager;
    auto metrics = metrics::Metrics::makeNullMetrics();
    BaggageSetter setter(manager, *metrics);
    Span span(
        nullptr,
        SpanContext(TraceID(),
                    123,
                    456,
                    static_cast<unsigned char>(SpanContext::Flag::kSampled),
                    SpanContext::StrMap()));
    auto baggage = span.context().baggage();
    setter.setBaggage(span, baggage, "abc", "123", logFn);
    ASSERT_EQ(1, baggage.size());
    ASSERT_EQ("123", baggage["abc"]);
    setter.setBaggage(span, baggage, "bcd", "234", logFn);
    ASSERT_EQ(1, baggage.size());
    setter.setBaggage(span, baggage, "abc", "1234567890", logFn);
    ASSERT_EQ("12345678", baggage["abc"]);
}